

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_model.pb.cc
# Opt level: O2

char * __thiscall
sentencepiece::ModelProto::_InternalParse(ModelProto *this,char *ptr,ParseContext *ctx)

{
  uint tag_00;
  bool bVar1;
  ModelProto_SentencePiece *msg;
  NormalizerSpec *msg_00;
  SelfTestData *msg_01;
  TrainerSpec *msg_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  char cVar2;
  uint32 tag;
  char *local_50;
  InternalMetadata *local_48;
  uint local_3c;
  ExtensionSet *local_38;
  
  local_48 = &(this->super_MessageLite)._internal_metadata_;
  local_38 = &this->_extensions_;
  local_50 = ptr;
LAB_001bf139:
  do {
    bVar1 = google::protobuf::internal::ParseContext::Done(ctx,&local_50);
    if (bVar1) {
      return local_50;
    }
    local_50 = google::protobuf::internal::ReadTag(local_50,&local_3c,0);
    tag_00 = local_3c;
    if (local_50 == (char *)0x0) {
      return (char *)0x0;
    }
    cVar2 = (char)local_3c;
    switch(local_3c >> 3) {
    case 1:
      if (cVar2 == '\n') {
        local_50 = local_50 + -1;
        do {
          local_50 = local_50 + 1;
          msg = google::protobuf::RepeatedPtrField<sentencepiece::ModelProto_SentencePiece>::Add
                          (&this->pieces_);
          local_50 = google::protobuf::internal::ParseContext::
                     ParseMessage<sentencepiece::ModelProto_SentencePiece>(ctx,msg,local_50);
          if (local_50 == (char *)0x0) {
            return (char *)0x0;
          }
        } while ((local_50 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_50 == '\n'));
        goto LAB_001bf139;
      }
      break;
    case 2:
      if (cVar2 != '\x12') break;
      msg_02 = _internal_mutable_trainer_spec(this);
      local_50 = google::protobuf::internal::ParseContext::ParseMessage<sentencepiece::TrainerSpec>
                           (ctx,msg_02,local_50);
      goto LAB_001bf2b5;
    case 3:
      if (cVar2 == '\x1a') {
        msg_00 = _internal_mutable_normalizer_spec(this);
LAB_001bf1f7:
        local_50 = google::protobuf::internal::ParseContext::
                   ParseMessage<sentencepiece::NormalizerSpec>(ctx,msg_00,local_50);
        goto LAB_001bf2b5;
      }
      break;
    case 4:
      if (cVar2 == '\"') {
        msg_01 = _internal_mutable_self_test_data(this);
        local_50 = google::protobuf::internal::ParseContext::
                   ParseMessage<sentencepiece::SelfTestData>(ctx,msg_01,local_50);
        goto LAB_001bf2b5;
      }
      break;
    case 5:
      if (cVar2 == '*') {
        msg_00 = _internal_mutable_denormalizer_spec(this);
        goto LAB_001bf1f7;
      }
    }
    if (((ulong)local_3c == 0) || ((local_3c & 7) == 4)) {
      (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = local_3c - 1;
      return local_50;
    }
    if (local_3c < 0x640) {
      if (((ulong)local_48->ptr_ & 1) == 0) {
        unknown = google::protobuf::internal::InternalMetadata::
                  mutable_unknown_fields_slow<std::__cxx11::string>(local_48);
      }
      else {
        unknown = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (((ulong)local_48->ptr_ & 0xfffffffffffffffe) + 8);
      }
      local_50 = google::protobuf::internal::UnknownFieldParse(tag_00,unknown,local_50,ctx);
    }
    else {
      local_50 = google::protobuf::internal::ExtensionSet::ParseField
                           (local_38,(ulong)local_3c,local_50,
                            (MessageLite *)_ModelProto_default_instance_,local_48,ctx);
    }
LAB_001bf2b5:
    if (local_50 == (char *)0x0) {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

const char* ModelProto::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // repeated .sentencepiece.ModelProto.SentencePiece pieces = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_pieces(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<10>(ptr));
        } else goto handle_unusual;
        continue;
      // optional .sentencepiece.TrainerSpec trainer_spec = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 18)) {
          ptr = ctx->ParseMessage(_internal_mutable_trainer_spec(), ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional .sentencepiece.NormalizerSpec normalizer_spec = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 26)) {
          ptr = ctx->ParseMessage(_internal_mutable_normalizer_spec(), ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional .sentencepiece.SelfTestData self_test_data = 4;
      case 4:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 34)) {
          ptr = ctx->ParseMessage(_internal_mutable_self_test_data(), ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional .sentencepiece.NormalizerSpec denormalizer_spec = 5;
      case 5:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 42)) {
          ptr = ctx->ParseMessage(_internal_mutable_denormalizer_spec(), ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
      if ((1600u <= tag)) {
        ptr = _extensions_.ParseField(tag, ptr,
            internal_default_instance(), &_internal_metadata_, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
        ptr = UnknownFieldParse(tag,
            _internal_metadata_.mutable_unknown_fields<std::string>(),
            ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}